

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

Node * prvTidyParseHTML(TidyDocImpl *doc,Node *html,GetTokenMode mode)

{
  TidyTagId TVar1;
  Node *pNVar2;
  Dict *pDVar3;
  Node *pNVar4;
  Bool BVar5;
  Node *node;
  Node **ppNVar6;
  Node *pNVar7;
  uint uVar8;
  GetTokenMode local_74;
  Node *local_70;
  TidyParserMemory memory;
  
  prvTidySetOptionBool(doc,TidyXmlTags,no);
  if (html == (Node *)0x0) {
    prvTidypopMemory(doc);
    local_70 = memory.original_node;
    local_74 = memory.reentry_mode;
    node = memory.reentry_node;
  }
  else {
    node = (Node *)0x0;
    memory.reentry_state = 0;
    local_74 = mode;
    local_70 = html;
  }
  pNVar7 = (Node *)0x0;
  pNVar2 = (Node *)0x0;
switchD_0013ae68_caseD_5:
  uVar8 = memory.reentry_state;
  memory.reentry_node = pNVar2;
  if (uVar8 == 1) {
    return (Node *)0x0;
  }
  if ((uVar8 & 0xfffffffd) == 0) {
    node = prvTidyGetToken(doc,IgnoreWhitespace);
  }
  memory.original_node._0_4_ = SUB84(local_70,0);
  memory.original_node._4_4_ = (undefined4)((ulong)local_70 >> 0x20);
  pNVar2 = memory.reentry_node;
  memory.reentry_state = 2;
  switch(uVar8) {
  case 0:
    if (node != (Node *)0x0) {
      pDVar3 = node->tag;
      if ((pDVar3 != (Dict *)0x0) && (memory.reentry_state = 4, pDVar3->id == TidyTag_HEAD))
      goto switchD_0013ae68_caseD_5;
      if (((local_70 != (Node *)0x0) && (pDVar3 == local_70->tag)) &&
         ((node->type == StartTag || (node->type == EndTag)))) {
        prvTidyReport(doc,local_70,node,0x235);
        prvTidyFreeNode(doc,node);
        memory.reentry_state = 0;
        goto switchD_0013ae68_caseD_5;
      }
      BVar5 = InsertMisc(local_70,node);
      memory.reentry_state = 0;
      if (BVar5 != no) goto switchD_0013ae68_caseD_5;
      prvTidyUngetToken(doc);
    }
    node = prvTidyInferredTag(doc,TidyTag_HEAD);
    memory.reentry_state = 4;
    goto switchD_0013ae68_caseD_5;
  default:
    memory.reentry_state = 1;
    goto switchD_0013ae68_caseD_5;
  case 2:
    if (node == (Node *)0x0) {
      node = (Node *)0x0;
      memory.reentry_state = 1;
      if (memory.reentry_node == (Node *)0x0) {
LAB_0013affb:
        node = prvTidyInferredTag(doc,TidyTag_BODY);
LAB_0013b006:
        memory.reentry_node = (Node *)0x0;
LAB_0013b008:
        pNVar2 = memory.reentry_node;
        memory.reentry_state = 3;
      }
      goto switchD_0013ae68_caseD_5;
    }
    if (node->tag == local_70->tag) {
      if (memory.reentry_node == (Node *)0x0 && node->type != StartTag) goto LAB_0013b19c;
    }
    else {
      BVar5 = InsertMisc(local_70,node);
      memory.reentry_state = 2;
      if (BVar5 != no) goto switchD_0013ae68_caseD_5;
      if (node->tag == (Dict *)0x0) {
LAB_0013b097:
        BVar5 = prvTidynodeIsElement(node);
        if ((BVar5 != no) && (pDVar3 = node->tag, pDVar3 != (Dict *)0x0)) {
          if ((pDVar3->model & 4) != 0) {
            MoveToHead(doc,local_70,node);
            break;
          }
          if ((memory.reentry_node != (Node *)0x0) && (pDVar3->id == TidyTag_FRAME))
          goto LAB_0013b19c;
        }
        prvTidyUngetToken(doc);
        if (memory.reentry_node == (Node *)0x0) {
          node = prvTidyInferredTag(doc,TidyTag_BODY);
          if (*(int *)((doc->config).value + 6) != 1) {
            prvTidyReport(doc,local_70,node,0x247);
          }
          prvTidyConstrainVersion(doc,0xfffffb6f);
          goto LAB_0013b006;
        }
        if (pNVar7 == (Node *)0x0) {
          pNVar7 = prvTidyInferredTag(doc,TidyTag_NOFRAMES);
          pNVar7->parent = memory.reentry_node;
          pNVar4 = (memory.reentry_node)->last;
          pNVar7->prev = pNVar4;
          ppNVar6 = &pNVar4->next;
          if (pNVar4 == (Node *)0x0) {
            ppNVar6 = &(memory.reentry_node)->content;
          }
          *ppNVar6 = pNVar7;
          (memory.reentry_node)->last = pNVar7;
        }
        else {
          prvTidyReport(doc,local_70,node,0x267);
          if (pNVar7->type == StartEndTag) {
            pNVar7->type = StartTag;
          }
        }
        prvTidyConstrainVersion(doc,0x490);
LAB_0013b24d:
        memory.reentry_state = 6;
        goto switchD_0013ae68_caseD_5;
      }
      TVar1 = node->tag->id;
      if (TVar1 == TidyTag_NOFRAMES) {
        if (node->type == StartTag) {
          if (memory.reentry_node == (Node *)0x0) {
            prvTidyReport(doc,local_70,node,0x235);
            prvTidyFreeNode(doc,node);
            goto LAB_0013affb;
          }
          if (pNVar7 != (Node *)0x0) goto LAB_0013b1ab;
          node->parent = memory.reentry_node;
          pNVar7 = (memory.reentry_node)->last;
          node->prev = pNVar7;
          ppNVar6 = &pNVar7->next;
          if (pNVar7 == (Node *)0x0) {
            ppNVar6 = &(memory.reentry_node)->content;
          }
          *ppNVar6 = node;
          (memory.reentry_node)->last = node;
          pNVar7 = node;
          goto LAB_0013b24d;
        }
      }
      else {
        if (TVar1 != TidyTag_FRAMESET) {
          if (TVar1 != TidyTag_BODY) goto LAB_0013b097;
          if (node->type != StartTag) goto LAB_0013b19c;
          if (((doc->config).value[1].v != 0) || (memory.reentry_node == (Node *)0x0)) {
            prvTidyConstrainVersion(doc,0xfffffb6f);
            goto LAB_0013b008;
          }
          prvTidyUngetToken(doc);
          if (pNVar7 == (Node *)0x0) {
            pNVar7 = prvTidyInferredTag(doc,TidyTag_NOFRAMES);
            prvTidyInsertNodeAtEnd(memory.reentry_node,pNVar7);
            prvTidyReport(doc,local_70,pNVar7,0x247);
            goto LAB_0013b24d;
          }
          memory.reentry_state = 6;
          if (pNVar7->type == StartEndTag) {
            pNVar7->type = StartTag;
          }
          goto switchD_0013ae68_caseD_5;
        }
        if (node->type == StartTag) {
          pNVar2 = node;
          memory.reentry_state = 8;
          if (memory.reentry_node != (Node *)0x0) {
            prvTidyReport(doc,local_70,node,0x237);
            pNVar2 = memory.reentry_node;
            memory.reentry_state = 8;
          }
          goto switchD_0013ae68_caseD_5;
        }
      }
LAB_0013b19c:
      prvTidyReport(doc,local_70,node,0x235);
    }
LAB_0013b1ab:
    prvTidyFreeNode(doc,node);
    break;
  case 3:
    goto switchD_0013ae68_caseD_3;
  case 4:
    memory.reentry_state = 5;
    memory.reentry_node = node;
    goto LAB_0013b38a;
  case 5:
    goto switchD_0013ae68_caseD_5;
  case 6:
    prvTidypushMemory(doc,(TidyParserMemory)
                          ZEXT3648(CONCAT432(local_74,CONCAT428(7,CONCAT424(local_74,CONCAT420((int)
                                                  ((ulong)memory.reentry_node >> 0x20),
                                                  CONCAT416((int)memory.reentry_node,
                                                            CONCAT412(memory.original_node._4_4_,
                                                                      CONCAT48(memory.original_node.
                                                                               _0_4_,
                                                  prvTidyParseHTML)))))))));
    return pNVar7;
  case 7:
    memory.reentry_node = node;
    break;
  case 8:
    memory.reentry_state = 9;
LAB_0013b38a:
    prvTidyInsertNodeAtEnd(local_70,node);
    memory.identity._0_4_ = 0x13adb3;
    goto LAB_0013b3a1;
  case 9:
    ppNVar6 = &node->content;
    while (pNVar2 = *ppNVar6, pNVar2 != (Node *)0x0) {
      if ((pNVar2->tag != (Dict *)0x0) && (pNVar2->tag->id == TidyTag_NOFRAMES)) {
        pNVar7 = pNVar2;
      }
      ppNVar6 = &pNVar2->next;
    }
    memory.reentry_node = node;
    node = (Node *)0x0;
  }
  pNVar2 = memory.reentry_node;
  memory.reentry_state = 2;
  goto switchD_0013ae68_caseD_5;
switchD_0013ae68_caseD_3:
  prvTidyInsertNodeAtEnd(local_70,node);
  memory.identity._0_4_ = 0;
  memory.reentry_node._0_4_ = 0;
  memory.reentry_node._4_4_ = 0;
  memory.reentry_state = 1;
LAB_0013b3a1:
  prvTidypushMemory(doc,(TidyParserMemory)
                        ZEXT3648(CONCAT432(local_74,CONCAT428(memory.reentry_state,
                                                              CONCAT424(local_74,CONCAT420(memory.
                                                  reentry_node._4_4_,
                                                  CONCAT416(memory.reentry_node._0_4_,
                                                            CONCAT412(memory.original_node._4_4_,
                                                                      CONCAT48(memory.original_node.
                                                                               _0_4_,(ulong)(uint)
                                                  memory.identity)))))))));
  return node;
}

Assistant:

Node* TY_(ParseHTML)( TidyDocImpl *doc, Node *html, GetTokenMode mode )
{
    Node *node = NULL;
    Node *head = NULL;
    Node *frameset = NULL;
    Node *noframes = NULL;
    DEBUG_LOG_COUNTERS;

    enum parserState {
        STATE_INITIAL,                /* This is the initial state for every parser. */
        STATE_COMPLETE,               /* Complete! */
        STATE_PRE_BODY,               /* In this state, we'll consider frames vs. body. */
        STATE_PARSE_BODY,             /* In this state, we can parse the body. */
        STATE_PARSE_HEAD,             /* In this state, we will setup head for parsing. */
        STATE_PARSE_HEAD_REENTER,     /* Resume here after parsing head. */
        STATE_PARSE_NOFRAMES,         /* In this state, we can parse noframes content. */
        STATE_PARSE_NOFRAMES_REENTER, /* In this state, we can restore more state. */
        STATE_PARSE_FRAMESET,         /* In this state, we will parse frameset content. */
        STATE_PARSE_FRAMESET_REENTER, /* We need to cleanup some things after parsing frameset. */
    } state = STATE_INITIAL;

    TY_(SetOptionBool)( doc, TidyXmlTags, no );

    if ( html == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node;
        DEBUG_LOG_REENTER_WITH_NODE(node);
        html = memory.original_node;
        state = memory.reentry_state;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.reentry_mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(html);
    }

    /*
     This main loop pulls tokens from the lexer until we're out of tokens,
     or until there's no more work to do.
     */
    while ( state != STATE_COMPLETE )
    {
        if ( state == STATE_INITIAL || state == STATE_PRE_BODY )
        {
            node = TY_(GetToken)( doc, IgnoreWhitespace );
            DEBUG_LOG_GOT_TOKEN(node);
        }

        switch ( state )
        {
            /**************************************************************
             This case is all about finding a head tag and dealing with
             cases were we don't, so that we can move on to parsing a head
             tag.
             **************************************************************/
            case STATE_INITIAL:
            {
                /*
                 The only way we can possibly be here is if the lexer
                 had nothing to give us. Thus we'll create our own
                 head, and set the signal to start parsing it.
                 */
                if (node == NULL)
                {
                    node = TY_(InferredTag)(doc, TidyTag_HEAD);
                    state = STATE_PARSE_HEAD;
                    continue;
                }

                /* We found exactly what we expected: head. */
                if ( nodeIsHEAD(node) )
                {
                    state = STATE_PARSE_HEAD;
                    continue;
                }

                /* We did not expect to find an html closing tag here! */
                if (html && (node->tag == html->tag) && (node->type == EndTag))
                {
                    TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /* Find and discard multiple <html> elements. */
                if (html && (node->tag == html->tag) && (node->type == StartTag))
                {
                    TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)(doc, node);
                    continue;
                }

                /* Deal with comments, etc. */
                if (InsertMisc(html, node))
                    continue;

                /*
                 At this point, we didn't find a head tag, so put the
                 token back and create our own head tag, so we can
                 move on.
                 */
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_HEAD);
                state = STATE_PARSE_HEAD;
                continue;
            } break;


            /**************************************************************
             This case determines whether we're dealing with body or
             frameset + noframes, and sets things up accordingly.
             **************************************************************/
            case STATE_PRE_BODY:
            {
                if (node == NULL )
                {
                    if (frameset == NULL) /* Implied body. */
                    {
                        node = TY_(InferredTag)(doc, TidyTag_BODY);
                        state = STATE_PARSE_BODY;
                    } else {
                        state = STATE_COMPLETE;
                    }

                    continue;
                }

                /* Robustly handle html tags. */
                if (node->tag == html->tag)
                {
                    if (node->type != StartTag && frameset == NULL)
                        TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);

                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /* Deal with comments, etc. */
                if (InsertMisc(html, node))
                    continue;

                /* If frameset document, coerce <body> to <noframes> */
                if ( nodeIsBODY(node) )
                {
                    if (node->type != StartTag)
                    {
                        TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        continue;
                    }

                    if ( cfg(doc, TidyAccessibilityCheckLevel) == 0 )
                    {
                        if (frameset != NULL)
                        {
                            TY_(UngetToken)( doc );

                            if (noframes == NULL)
                            {
                                noframes = TY_(InferredTag)(doc, TidyTag_NOFRAMES);
                                TY_(InsertNodeAtEnd)(frameset, noframes);
                                TY_(Report)(doc, html, noframes, INSERTING_TAG);
                            }
                            else
                            {
                                if (noframes->type == StartEndTag)
                                    noframes->type = StartTag;
                            }

                            state = STATE_PARSE_NOFRAMES;
                            continue;
                        }
                    }

                    TY_(ConstrainVersion)(doc, ~VERS_FRAMESET);
                    state = STATE_PARSE_BODY;
                    continue;
                }

                /* Flag an error if we see more than one frameset. */
                if ( nodeIsFRAMESET(node) )
                {
                    if (node->type != StartTag)
                    {
                        TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        continue;
                    }

                    if (frameset != NULL)
                        TY_(Report)(doc, html, node, DUPLICATE_FRAMESET);
                    else
                        frameset = node;

                    state = STATE_PARSE_FRAMESET;
                    continue;
                }

                /* If not a frameset document coerce <noframes> to <body>. */
                if ( nodeIsNOFRAMES(node) )
                {
                    if (node->type != StartTag)
                    {
                        TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        continue;
                    }

                    if (frameset == NULL)
                    {
                        TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        node = TY_(InferredTag)(doc, TidyTag_BODY);
                        state = STATE_PARSE_BODY;
                        continue;
                    }

                    if (noframes == NULL)
                    {
                        noframes = node;
                        TY_(InsertNodeAtEnd)(frameset, noframes);
                        state = STATE_PARSE_NOFRAMES;
                    }
                    else
                    {
                        TY_(FreeNode)( doc, node);
                    }

                    continue;
                }

                /* Deal with some other element that we're not expecting. */
                if (TY_(nodeIsElement)(node))
                {
                    if (node->tag && node->tag->model & CM_HEAD)
                    {
                        MoveToHead(doc, html, node);
                        continue;
                    }

                    /* Discard illegal frame element following a frameset. */
                    if ( frameset != NULL && nodeIsFRAME(node) )
                    {
                        TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)(doc, node);
                        continue;
                    }
                }

                TY_(UngetToken)( doc );

                /* Insert other content into noframes element. */
                if (frameset)
                {
                    if (noframes == NULL)
                    {
                        noframes = TY_(InferredTag)(doc, TidyTag_NOFRAMES);
                        TY_(InsertNodeAtEnd)(frameset, noframes);
                    }
                    else
                    {
                        TY_(Report)(doc, html, node, NOFRAMES_CONTENT);
                        if (noframes->type == StartEndTag)
                            noframes->type = StartTag;
                    }

                    TY_(ConstrainVersion)(doc, VERS_FRAMESET);
                    state = STATE_PARSE_NOFRAMES;
                    continue;
                }

                node = TY_(InferredTag)(doc, TidyTag_BODY);

                /* Issue #132 - disable inserting BODY tag warning
                 BUT only if NOT --show-body-only yes */
                if (!showingBodyOnly(doc))
                    TY_(Report)(doc, html, node, INSERTING_TAG );

                TY_(ConstrainVersion)(doc, ~VERS_FRAMESET);
                state = STATE_PARSE_BODY;
                continue;
            } break;


            /**************************************************************
             In this case, we're ready to parse the head, and move on to
             look for the body or body alternative.
             **************************************************************/
            case STATE_PARSE_HEAD:
            {
                TidyParserMemory memory = {0};
                memory.identity = TY_(ParseHTML);
                memory.mode = mode;
                memory.original_node = html;
                memory.reentry_node = node;
                memory.reentry_mode = mode;
                memory.reentry_state = STATE_PARSE_HEAD_REENTER;
                TY_(InsertNodeAtEnd)(html, node);
                TY_(pushMemory)( doc, memory );
                DEBUG_LOG_EXIT_WITH_NODE(node);
                return node;
            } break;

            case STATE_PARSE_HEAD_REENTER:
            {
                head = node;
                state = STATE_PRE_BODY;
            } break;


            /**************************************************************
             In this case, we can finally parse a body.
             **************************************************************/
            case STATE_PARSE_BODY:
            {
                TidyParserMemory memory = {0};
                memory.identity = NULL; /* we don't need to reenter */
                memory.mode = mode;
                memory.original_node = html;
                memory.reentry_node = NULL;
                memory.reentry_mode = mode;
                memory.reentry_state = STATE_COMPLETE;
                TY_(InsertNodeAtEnd)(html, node);
                TY_(pushMemory)( doc, memory );
                DEBUG_LOG_EXIT_WITH_NODE(node);
                return node;
            } break;


            /**************************************************************
             In this case, we will parse noframes. If necessary, the
             node is already inserted in the proper spot.
             **************************************************************/
            case STATE_PARSE_NOFRAMES:
            {
                TidyParserMemory memory = {0};
                memory.identity = TY_(ParseHTML);
                memory.mode = mode;
                memory.original_node = html;
                memory.reentry_node = frameset;
                memory.reentry_mode = mode;
                memory.reentry_state = STATE_PARSE_NOFRAMES_REENTER;
                TY_(pushMemory)( doc, memory );
                DEBUG_LOG_EXIT_WITH_NODE(node);
                return noframes;
            } break;

            case STATE_PARSE_NOFRAMES_REENTER:
            {
                frameset = node;
                state = STATE_PRE_BODY;
            } break;


            /**************************************************************
             In this case, we parse the frameset, and look for noframes
             content to merge later if necessary.
             **************************************************************/
            case STATE_PARSE_FRAMESET:
            {
                TidyParserMemory memory = {0};
                memory.identity = TY_(ParseHTML);
                memory.mode = mode;
                memory.original_node = html;
                memory.reentry_node = frameset;
                memory.reentry_mode = mode;
                memory.reentry_state = STATE_PARSE_FRAMESET_REENTER;
                TY_(InsertNodeAtEnd)(html, node);
                TY_(pushMemory)( doc, memory );
                DEBUG_LOG_EXIT_WITH_NODE(node);
                return node;
            } break;

            case (STATE_PARSE_FRAMESET_REENTER):
            {
                frameset = node;
                /*
                 See if it includes a noframes element so that
                 we can merge subsequent noframes elements.
                 */
                for (node = frameset->content; node; node = node->next)
                {
                    if ( nodeIsNOFRAMES(node) )
                        noframes = node;
                }
                state = STATE_PRE_BODY;
            } break;


            /**************************************************************
             We really shouldn't get here, but if we do, finish nicely.
             **************************************************************/
            default:
            {
                state = STATE_COMPLETE;
            }
        } /* switch */
    } /* while */

    DEBUG_LOG_EXIT;
    return NULL;
}